

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O3

char * get_node_value(IXML_Node *node)

{
  long lVar1;
  char *pcVar2;
  
  lVar1 = ixmlNode_getFirstChild();
  if (lVar1 != 0) {
    pcVar2 = (char *)ixmlNode_getNodeValue(lVar1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static const DOMString get_node_value(IXML_Node *node)
{
	IXML_Node *text_node = NULL;
	const DOMString text_value = NULL;

	text_node = ixmlNode_getFirstChild(node);
	if (text_node == NULL) {
		return NULL;
	}

	text_value = ixmlNode_getNodeValue(text_node);
	return text_value;
}